

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_next(lua_State *L,int idx)

{
  lu_byte lVar1;
  ushort uVar2;
  int *piVar3;
  int iVar4;
  TValue *pTVar5;
  StkId pTVar6;
  char *__assertion;
  
  iVar4 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar4 + 1;
  if (iVar4 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x5dd,"int lua_next(lua_State *, int)");
  }
  pTVar5 = index2addr(L,idx);
  uVar2 = pTVar5->tt_;
  if ((uVar2 & 0xf) != 5) {
    __assert_fail("((((((((t))->tt_)) & 0x0F)) == (5))) && \"table expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x5df,"int lua_next(lua_State *, int)");
  }
  if ((uVar2 == 0x8025) || (uVar2 == 0x8015)) {
    lVar1 = ((RaviArray *)(pTVar5->value_).gc)->tt;
    if ((lVar1 == '\x15') || (lVar1 == '%')) {
      iVar4 = raviH_next(L,(RaviArray *)(pTVar5->value_).gc,L->top + -1);
LAB_00114c78:
      if (iVar4 == 0) {
        L->top = L->top + -1;
      }
      else {
        pTVar6 = L->top + 1;
        L->top = pTVar6;
        if (L->ci->top < pTVar6) {
          __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x5e2,"int lua_next(lua_State *, int)");
        }
      }
      piVar3 = *(int **)&L[-1].hookmask;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        return iVar4;
      }
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x5e6,"int lua_next(lua_State *, int)");
    }
    __assertion = 
    "((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
    ;
  }
  else if (uVar2 == 0x8005) {
    if (((Table *)(pTVar5->value_).gc)->tt == '\x05') {
      iVar4 = luaH_next(L,(Table *)(pTVar5->value_).gc,L->top + -1);
      goto LAB_00114c78;
    }
    __assertion = "(((t)->value_).gc)->tt == 5";
  }
  else {
    __assertion = 
    "(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x5e0,"int lua_next(lua_State *, int)");
}

Assistant:

LUA_API int lua_next (lua_State *L, int idx) {
  StkId t;
  int more;
  lua_lock(L);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  more = ttisLtable(t) ? luaH_next(L, hvalue(t), L->top - 1) : raviH_next(L, arrvalue(t), L->top - 1);
  if (more) {
    api_incr_top(L);
  }
  else  /* no more elements */
    L->top -= 1;  /* remove key */
  lua_unlock(L);
  return more;
}